

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O2

bool __thiscall cali::Node::equals(Node *this,cali_id_t attr,Variant *v)

{
  bool bVar1;
  
  bVar1 = operator==(&this->m_data,v);
  return bVar1 && this->m_attribute == attr;
}

Assistant:

bool equals(cali_id_t attr, const Variant& v) const { return m_data == v && m_attribute == attr; }